

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_pool.hpp
# Opt level: O2

packet_ptr __thiscall libtorrent::aux::packet_slab::alloc(packet_slab *this)

{
  long lVar1;
  int *in_RSI;
  
  lVar1 = *(long *)(in_RSI + 6);
  if (*(long *)(in_RSI + 4) == lVar1) {
    create_packet((aux *)this,*in_RSI);
  }
  else {
    *(undefined8 *)this = *(undefined8 *)(lVar1 + -8);
    *(undefined8 *)(lVar1 + -8) = 0;
    ::std::
    vector<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::allocator<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_>_>
    ::pop_back((vector<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::allocator<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_>_>
                *)(in_RSI + 4));
  }
  return (__uniq_ptr_data<libtorrent::aux::packet,_libtorrent::aux::packet_deleter,_true,_true>)
         (__uniq_ptr_data<libtorrent::aux::packet,_libtorrent::aux::packet_deleter,_true,_true>)this
  ;
}

Assistant:

packet_ptr alloc()
		{
			if (m_storage.empty()) return create_packet(allocate_size);
			auto ret = std::move(m_storage.back());
#ifdef TORRENT_ADDRESS_SANITIZER
			__asan_unpoison_memory_region(ret.get(), sizeof(packet) + std::size_t(allocate_size));
#endif
			m_storage.pop_back();
			return ret;
		}